

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<int>::RepeatedField(RepeatedField<int> *this,Arena *arena)

{
  Rep *pRVar1;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->rep_ = (Rep *)0x0;
  if (arena != (Arena *)0x0) {
    pRVar1 = (Rep *)Arena::AllocateAligned(arena,(type_info *)&char::typeinfo,8);
    this->rep_ = pRVar1;
    pRVar1->arena = arena;
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(Arena* arena)
  : current_size_(0),
    total_size_(0),
    rep_(NULL) {
  // In case arena is NULL, then we do not create rep_, as code has an invariant
  // `rep_ == NULL then arena == NULL`.
  if (arena != NULL) {
    rep_ = reinterpret_cast<Rep*>(
        ::google::protobuf::Arena::CreateArray<char>(arena, kRepHeaderSize));
    rep_->arena = arena;
  }
}